

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::FileDescriptorProto::unsafe_arena_set_allocated_source_code_info
          (FileDescriptorProto *this,SourceCodeInfo *source_code_info)

{
  Arena *pAVar1;
  long in_RSI;
  long in_RDI;
  FileDescriptorProto *in_stack_ffffffffffffffc0;
  
  pAVar1 = GetArenaNoVirtual(in_stack_ffffffffffffffc0);
  if ((pAVar1 == (Arena *)0x0) && (*(long **)(in_RDI + 0xd0) != (long *)0x0)) {
    (**(code **)(**(long **)(in_RDI + 0xd0) + 8))();
  }
  *(long *)(in_RDI + 0xd0) = in_RSI;
  if (in_RSI == 0) {
    *(uint *)(in_RDI + 0x10) = *(uint *)(in_RDI + 0x10) & 0xffffffef;
  }
  else {
    *(uint *)(in_RDI + 0x10) = *(uint *)(in_RDI + 0x10) | 0x10;
  }
  return;
}

Assistant:

void FileDescriptorProto::unsafe_arena_set_allocated_source_code_info(
    PROTOBUF_NAMESPACE_ID::SourceCodeInfo* source_code_info) {
  if (GetArenaNoVirtual() == nullptr) {
    delete source_code_info_;
  }
  source_code_info_ = source_code_info;
  if (source_code_info) {
    _has_bits_[0] |= 0x00000010u;
  } else {
    _has_bits_[0] &= ~0x00000010u;
  }
  // @@protoc_insertion_point(field_unsafe_arena_set_allocated:google.protobuf.FileDescriptorProto.source_code_info)
}